

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbAbc.c
# Opt level: O1

Acb_Ntk_t *
Acb_NtkFromNdr(char *pFileName,void *pModule,Abc_Nam_t *pNames,Vec_Int_t *vWeights,int nNameIdMax)

{
  byte bVar1;
  byte bVar2;
  char cVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  Abc_Nam_t *pAVar9;
  Acb_Man_t *p;
  Acb_Ntk_t *p_00;
  void *__s;
  int *piVar10;
  long lVar11;
  char *pcVar12;
  int iVar13;
  Abc_Nam_t *pAVar14;
  int iVar15;
  Abc_Nam_t *pStrs;
  int *piVar16;
  int Ent_4;
  ulong uVar17;
  Acb_ObjType_t Type;
  int iVar18;
  int iVar19;
  int iVar20;
  undefined4 in_register_00000084;
  Abc_Nam_t *pMods;
  long lVar21;
  long lVar22;
  Hash_IntMan_t *in_R9;
  long lVar23;
  int iVar24;
  long lVar25;
  int local_34;
  
  pMods = (Abc_Nam_t *)CONCAT44(in_register_00000084,nNameIdMax);
  pAVar14 = (Abc_Nam_t *)vWeights;
  pAVar9 = Abc_NamRef(pNames);
  p = Acb_ManAlloc(pFileName,(int)pAVar9,pStrs,pAVar14,pMods,in_R9);
  iVar20 = 0;
  iVar4 = Abc_NamStrFindOrAdd(p->pStrs,p->pName,(int *)0x0);
  iVar5 = Abc_NamStrFind(p->pStrs,"1\'b0");
  lVar11 = *(long *)((long)pModule + 0x10);
  iVar13 = *(int *)(lVar11 + 8) + 2;
  iVar15 = 0;
  if (3 < iVar13) {
    iVar18 = 3;
    iVar15 = 0;
    do {
      lVar21 = (long)iVar18;
      bVar1 = *(byte *)(*(long *)((long)pModule + 8) + lVar21);
      if (bVar1 == 3) {
        for (iVar19 = iVar18 + 1; uVar8 = 1, iVar19 < *(int *)(lVar11 + lVar21 * 4) + iVar18;
            iVar19 = iVar19 + iVar24) {
          lVar25 = (long)iVar19;
          bVar2 = *(byte *)(*(long *)((long)pModule + 8) + lVar25);
          if (bVar2 == 6) {
            uVar8 = (uint)(*(int *)(lVar11 + lVar25 * 4) == 3);
            break;
          }
          if (bVar2 == 0) goto LAB_0038ef7f;
          iVar24 = 1;
          if (bVar2 < 4) {
            iVar24 = *(int *)(lVar11 + lVar25 * 4);
          }
        }
        iVar15 = iVar15 + uVar8;
      }
      else if (bVar1 == 0) goto LAB_0038ef7f;
      iVar19 = 1;
      if (bVar1 < 4) {
        iVar19 = *(int *)(lVar11 + lVar21 * 4);
      }
      iVar18 = iVar18 + iVar19;
    } while (iVar18 < iVar13);
  }
  if (3 < iVar13) {
    iVar18 = 3;
    iVar20 = 0;
    do {
      lVar21 = (long)iVar18;
      bVar1 = *(byte *)(*(long *)((long)pModule + 8) + lVar21);
      if (bVar1 == 3) {
        for (iVar19 = iVar18 + 1; uVar8 = 1, iVar19 < *(int *)(lVar11 + lVar21 * 4) + iVar18;
            iVar19 = iVar19 + iVar24) {
          lVar25 = (long)iVar19;
          bVar2 = *(byte *)(*(long *)((long)pModule + 8) + lVar25);
          if (bVar2 == 6) {
            uVar8 = (uint)(*(int *)(lVar11 + lVar25 * 4) == 4);
            break;
          }
          if (bVar2 == 0) goto LAB_0038ef7f;
          iVar24 = 1;
          if (bVar2 < 4) {
            iVar24 = *(int *)(lVar11 + lVar25 * 4);
          }
        }
        iVar20 = iVar20 + uVar8;
      }
      else if (bVar1 == 0) goto LAB_0038ef7f;
      iVar19 = 1;
      if (bVar1 < 4) {
        iVar19 = *(int *)(lVar11 + lVar21 * 4);
      }
      iVar18 = iVar18 + iVar19;
    } while (iVar18 < iVar13);
  }
  iVar18 = 0;
  if (3 < iVar13) {
    iVar19 = 3;
    iVar18 = 0;
    do {
      bVar1 = *(byte *)(*(long *)((long)pModule + 8) + (long)iVar19);
      if (bVar1 == 0) goto LAB_0038ef7f;
      iVar24 = 1;
      if (bVar1 < 4) {
        iVar24 = *(int *)(lVar11 + (long)iVar19 * 4);
      }
      iVar18 = iVar18 + (uint)(bVar1 == 3);
      iVar19 = iVar19 + iVar24;
    } while (iVar19 < iVar13);
  }
  p_00 = Acb_NtkAlloc(p,iVar4,iVar15,iVar20,iVar18);
  iVar4 = 0x10;
  if (0xe < nNameIdMax - 1U) {
    iVar4 = nNameIdMax;
  }
  if (iVar4 == 0) {
    __s = (void *)0x0;
  }
  else {
    __s = malloc((long)iVar4 << 2);
  }
  if (__s != (void *)0x0) {
    memset(__s,0,(long)nNameIdMax << 2);
  }
  uVar8 = (p_00->vObjType).nCap;
  if ((p_00->vObjWeight).nCap < (int)uVar8) {
    piVar10 = (p_00->vObjWeight).pArray;
    if (piVar10 == (int *)0x0) {
      piVar10 = (int *)malloc((long)(int)uVar8 << 2);
    }
    else {
      piVar10 = (int *)realloc(piVar10,(long)(int)uVar8 << 2);
    }
    (p_00->vObjWeight).pArray = piVar10;
    if (piVar10 == (int *)0x0) goto LAB_0038f0fc;
    (p_00->vObjWeight).nCap = uVar8;
  }
  if (0 < (int)uVar8) {
    memset((p_00->vObjWeight).pArray,0,(ulong)uVar8 * 4);
  }
  (p_00->vObjWeight).nSize = uVar8;
  uVar8 = (p_00->vObjType).nCap;
  if ((p_00->vObjName).nCap < (int)uVar8) {
    piVar10 = (p_00->vObjName).pArray;
    if (piVar10 == (int *)0x0) {
      piVar10 = (int *)malloc((long)(int)uVar8 << 2);
    }
    else {
      piVar10 = (int *)realloc(piVar10,(long)(int)uVar8 << 2);
    }
    (p_00->vObjName).pArray = piVar10;
    if (piVar10 == (int *)0x0) {
LAB_0038f0fc:
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    (p_00->vObjName).nCap = uVar8;
  }
  if (0 < (int)uVar8) {
    memset((p_00->vObjName).pArray,0,(ulong)uVar8 * 4);
  }
  (p_00->vObjName).nSize = uVar8;
  lVar11 = *(long *)((long)pModule + 0x10);
  if (3 < *(int *)(lVar11 + 8) + 2) {
    iVar4 = 3;
    do {
      lVar21 = *(long *)((long)pModule + 8);
      lVar25 = (long)iVar4;
      if (*(char *)(lVar21 + lVar25) == '\x03') {
        iVar13 = iVar4 + 1;
        iVar20 = *(int *)(lVar11 + lVar25 * 4) + iVar4;
        uVar8 = 0xffffffff;
        iVar15 = iVar13;
        if (iVar13 < iVar20) {
          do {
            lVar22 = (long)iVar15;
            bVar1 = *(byte *)(lVar21 + lVar22);
            if (bVar1 == 6) {
              if (*(int *)(lVar11 + lVar22 * 4) != 3) goto LAB_0038e5ae;
              break;
            }
            if (bVar1 == 0) goto LAB_0038ef7f;
            iVar18 = 1;
            if (bVar1 < 4) {
              iVar18 = *(int *)(lVar11 + lVar22 * 4);
            }
            iVar15 = iVar15 + iVar18;
          } while (iVar15 < iVar20);
          do {
            if (iVar20 <= iVar13) break;
            lVar22 = (long)iVar13;
            bVar1 = *(byte *)(lVar21 + lVar22);
            if (bVar1 == 5) {
              uVar8 = *(uint *)(lVar11 + lVar22 * 4);
              break;
            }
            if (bVar1 == 0) goto LAB_0038ef7f;
            iVar15 = 1;
            if (bVar1 < 4) {
              iVar15 = *(int *)(lVar11 + lVar22 * 4);
            }
            iVar13 = iVar13 + iVar15;
          } while( true );
        }
        uVar6 = Acb_ObjAlloc(p_00,ABC_OPER_CI,0,(int)lVar21);
        if (((int)uVar8 < 0) || (nNameIdMax <= (int)uVar8)) goto LAB_0038f004;
        *(uint *)((long)__s + (ulong)uVar8 * 4) = uVar6;
        if ((int)uVar6 < 1) goto LAB_0038f023;
        iVar13 = (p_00->vObjName).nSize;
        if (iVar13 < 1) goto LAB_0038effb;
        if (iVar13 <= (int)uVar6) goto LAB_0038ef9e;
        piVar10 = (p_00->vObjName).pArray;
        if (piVar10[uVar6] != 0) goto LAB_0038efdc;
        piVar10[uVar6] = uVar8;
        if (vWeights == (Vec_Int_t *)0x0) {
          iVar13 = 1;
        }
        else {
          if (vWeights->nSize <= (int)uVar8) goto LAB_0038ef9e;
          iVar13 = vWeights->pArray[uVar8];
        }
        iVar15 = (p_00->vObjWeight).nSize;
        if (iVar15 < 1) goto LAB_0038f0be;
        if (iVar15 <= (int)uVar6) goto LAB_0038ef9e;
        piVar10 = (p_00->vObjWeight).pArray;
        if (piVar10[uVar6] != 0) goto LAB_0038f09f;
        piVar10[uVar6] = iVar13;
      }
      else if (*(char *)(lVar21 + lVar25) == '\0') goto LAB_0038ef7f;
LAB_0038e5ae:
      bVar1 = *(byte *)(*(long *)((long)pModule + 8) + lVar25);
      if (bVar1 == 0) goto LAB_0038ef7f;
      iVar13 = 1;
      if (bVar1 < 4) {
        iVar13 = *(int *)(*(long *)((long)pModule + 0x10) + lVar25 * 4);
      }
      iVar4 = iVar4 + iVar13;
      lVar11 = *(long *)((long)pModule + 0x10);
    } while (iVar4 < *(int *)(lVar11 + 8) + 2);
  }
  lVar11 = *(long *)((long)pModule + 0x10);
  if (3 < *(int *)(lVar11 + 8) + 2) {
    iVar4 = 3;
    do {
      lVar21 = (long)iVar4;
      cVar3 = *(char *)(*(long *)((long)pModule + 8) + lVar21);
      if (cVar3 == '\n') {
        iVar13 = *(int *)(lVar11 + lVar21 * 4);
        uVar8 = Acb_ObjAlloc(p_00,ABC_OPER_CONST_F,0,10);
        if (((long)iVar13 < 0) || (nNameIdMax <= iVar13)) goto LAB_0038f004;
        *(uint *)((long)__s + (long)iVar13 * 4) = uVar8;
        if ((int)uVar8 < 1) goto LAB_0038f023;
        iVar15 = (p_00->vObjName).nSize;
        if (iVar15 < 1) goto LAB_0038effb;
        if (iVar15 <= (int)uVar8) goto LAB_0038ef9e;
        piVar10 = (p_00->vObjName).pArray;
        if (piVar10[uVar8] != 0) goto LAB_0038efdc;
        piVar10[uVar8] = iVar13;
        Vec_IntPush(&p_00->vTargets,uVar8);
      }
      else if (cVar3 == '\0') goto LAB_0038ef7f;
      bVar1 = *(byte *)(*(long *)((long)pModule + 8) + lVar21);
      if (bVar1 == 0) goto LAB_0038ef7f;
      iVar13 = 1;
      if (bVar1 < 4) {
        iVar13 = *(int *)(*(long *)((long)pModule + 0x10) + lVar21 * 4);
      }
      iVar4 = iVar4 + iVar13;
      lVar11 = *(long *)((long)pModule + 0x10);
    } while (iVar4 < *(int *)(lVar11 + 8) + 2);
  }
  lVar11 = *(long *)((long)pModule + 0x10);
  if (3 < *(int *)(lVar11 + 8) + 2) {
    iVar4 = 3;
LAB_0038e6e4:
    lVar21 = *(long *)((long)pModule + 8);
    lVar25 = (long)iVar4;
    if (*(char *)(lVar21 + lVar25) != '\x03') {
      if (*(char *)(lVar21 + lVar25) != '\0') goto LAB_0038e8ce;
      goto LAB_0038ef7f;
    }
    iVar20 = *(int *)(lVar11 + lVar25 * 4) + iVar4;
    iVar13 = iVar4 + 1;
    for (iVar15 = iVar13; iVar15 < iVar20; iVar15 = iVar15 + iVar18) {
      lVar22 = (long)iVar15;
      bVar1 = *(byte *)(lVar21 + lVar22);
      if (bVar1 == 6) {
        if ((iVar13 < iVar20) && (iVar15 = iVar13, *(int *)(lVar11 + lVar22 * 4) != 3))
        goto LAB_0038e760;
        break;
      }
      if (bVar1 == 0) goto LAB_0038ef7f;
      iVar18 = 1;
      if (bVar1 < 4) {
        iVar18 = *(int *)(lVar11 + lVar22 * 4);
      }
    }
    goto LAB_0038e8ce;
  }
LAB_0038e904:
  lVar11 = *(long *)((long)pModule + 0x10);
  if (*(int *)(lVar11 + 8) + 2 < 4) {
LAB_0038ec52:
    lVar11 = *(long *)((long)pModule + 0x10);
    if (3 < *(int *)(lVar11 + 8) + 2) {
      iVar4 = 3;
      do {
        lVar21 = *(long *)((long)pModule + 8);
        lVar25 = (long)iVar4;
        if (*(char *)(lVar21 + lVar25) == '\x03') {
          iVar13 = iVar4 + 1;
          iVar18 = *(int *)(lVar11 + lVar25 * 4) + iVar4;
          iVar15 = -1;
          iVar20 = iVar13;
          if (iVar13 < iVar18) {
            do {
              lVar22 = (long)iVar20;
              bVar1 = *(byte *)(lVar21 + lVar22);
              iVar19 = iVar13;
              if (bVar1 == 6) {
                if (*(int *)(lVar11 + lVar22 * 4) != 4) goto LAB_0038eebc;
                break;
              }
              if (bVar1 == 0) goto LAB_0038ef7f;
              iVar24 = 1;
              if (bVar1 < 4) {
                iVar24 = *(int *)(lVar11 + lVar22 * 4);
              }
              iVar20 = iVar20 + iVar24;
            } while (iVar20 < iVar18);
            do {
              if (iVar18 <= iVar19) break;
              lVar22 = (long)iVar19;
              bVar1 = *(byte *)(lVar21 + lVar22);
              if (bVar1 == 5) {
                iVar15 = *(int *)(lVar11 + lVar22 * 4);
                break;
              }
              if (bVar1 == 0) goto LAB_0038ef7f;
              iVar20 = 1;
              if (bVar1 < 4) {
                iVar20 = *(int *)(lVar11 + lVar22 * 4);
              }
              iVar19 = iVar19 + iVar20;
            } while( true );
          }
          pcVar12 = Abc_NamStr(p->pStrs,iVar15);
          lVar11 = *(long *)((long)pModule + 0x10);
          iVar15 = *(int *)(lVar11 + lVar25 * 4) + iVar4;
          uVar8 = 0;
          if (iVar13 < iVar15) {
            piVar10 = (int *)0x0;
            do {
              lVar21 = (long)iVar13;
              bVar1 = *(byte *)(*(long *)((long)pModule + 8) + lVar21);
              if (bVar1 == 4) {
                uVar8 = uVar8 + 1;
                if (piVar10 == (int *)0x0) {
                  piVar10 = (int *)(lVar11 + lVar21 * 4);
                }
              }
              else {
                if (bVar1 == 0) goto LAB_0038ef7f;
                if (piVar10 != (int *)0x0) break;
              }
              if (bVar1 == 0) goto LAB_0038ef7f;
              iVar20 = 1;
              if (bVar1 < 4) {
                iVar20 = *(int *)(lVar11 + lVar21 * 4);
              }
              iVar13 = iVar13 + iVar20;
            } while (iVar13 < iVar15);
            uVar8 = (uint)(uVar8 == 1);
          }
          else {
            piVar10 = (int *)0x0;
          }
          if ((char)uVar8 == '\0') {
            __assert_fail("nArray == 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbAbc.c"
                          ,0xdb,
                          "Acb_Ntk_t *Acb_NtkFromNdr(char *, void *, Abc_Nam_t *, Vec_Int_t *, int)"
                         );
          }
          uVar8 = Acb_ObjAlloc(p_00,ABC_OPER_CO,1,(int)lVar11);
          iVar13 = *piVar10;
          if (((long)iVar13 < 0) || (nNameIdMax <= iVar13)) {
LAB_0038ef9e:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          if (*(int *)((long)__s + (long)iVar13 * 4) == 0) {
            printf("Adding constant 0 driver to non-driven PO \"%s\".\n",pcVar12);
            iVar13 = *piVar10;
            if (((long)iVar13 < 0) || (nNameIdMax <= iVar13)) {
LAB_0038f004:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
            }
            *(int *)((long)__s + (long)iVar13 * 4) = iVar5;
          }
          iVar13 = *piVar10;
          if (((long)iVar13 < 0) || (nNameIdMax <= iVar13)) goto LAB_0038ef9e;
          if ((int)uVar8 < 1) {
LAB_0038f061:
            __assert_fail("i>0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acb.h"
                          ,0xfe,"int Acb_ObjFanOffset(Acb_Ntk_t *, int)");
          }
          if ((p_00->vObjFans).nSize <= (int)uVar8) goto LAB_0038ef9e;
          iVar15 = (p_00->vObjFans).pArray[uVar8];
          if (((long)iVar15 < 0) || ((p_00->vFanSto).nSize <= iVar15)) {
LAB_0038efbd:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
          }
          iVar13 = *(int *)((long)__s + (long)iVar13 * 4);
          if (iVar13 < 1) {
LAB_0038f080:
            __assert_fail("iFanin > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acb.h"
                          ,0x1a3,"void Acb_ObjAddFanin(Acb_Ntk_t *, int, int)");
          }
          piVar16 = (p_00->vFanSto).pArray + iVar15;
          iVar15 = *piVar16;
          if (piVar16[(long)iVar15 + 1] != -1) {
LAB_0038f042:
            __assert_fail("pFanins[ 1 + pFanins[0] ] == -1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acb.h"
                          ,0x1a4,"void Acb_ObjAddFanin(Acb_Ntk_t *, int, int)");
          }
          *piVar16 = iVar15 + 1;
          piVar16[(long)iVar15 + 1] = iVar13;
          iVar13 = (p_00->vObjName).nSize;
          if (iVar13 < 1) goto LAB_0038effb;
          if (iVar13 <= (int)uVar8) goto LAB_0038ef9e;
          piVar16 = (p_00->vObjName).pArray;
          if (piVar16[uVar8] != 0) {
LAB_0038efdc:
            __assert_fail("Acb_ObjName(p, i) == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acb.h"
                          ,0x11e,"void Acb_ObjSetName(Acb_Ntk_t *, int, int)");
          }
          piVar16[uVar8] = *piVar10;
        }
        else if (*(char *)(lVar21 + lVar25) == '\0') {
LAB_0038ef7f:
          __assert_fail("p->pHead[i]",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/miniaig/ndr.h"
                        ,0x7e,"int Ndr_DataType(Ndr_Data_t *, int)");
        }
LAB_0038eebc:
        bVar1 = *(byte *)(*(long *)((long)pModule + 8) + lVar25);
        if (bVar1 == 0) goto LAB_0038ef7f;
        iVar13 = 1;
        if (bVar1 < 4) {
          iVar13 = *(int *)(*(long *)((long)pModule + 0x10) + lVar25 * 4);
        }
        iVar4 = iVar4 + iVar13;
        lVar11 = *(long *)((long)pModule + 0x10);
      } while (iVar4 < *(int *)(lVar11 + 8) + 2);
    }
    if (__s != (void *)0x0) {
      free(__s);
    }
    p_00->nRegs = 0;
    pAVar14 = p->pMods;
    pcVar12 = Abc_NamStr(p_00->pDesign->pStrs,p_00->NameId);
    iVar4 = Abc_NamStrFindOrAdd(pAVar14,pcVar12,&local_34);
    if (local_34 == 0) {
      if (iVar4 != p_00->Id) {
        __assert_fail("NtkId == pNtk->Id",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acb.h"
                      ,0x2a0,"void Acb_NtkAdd(Acb_Man_t *, Acb_Ntk_t *)");
      }
    }
    else {
      pcVar12 = Abc_NamStr(p_00->pDesign->pStrs,p_00->NameId);
      printf("Network with name \"%s\" already exists.\n",pcVar12);
    }
    return p_00;
  }
  iVar4 = 3;
LAB_0038e91d:
  lVar21 = *(long *)((long)pModule + 8);
  lVar25 = (long)iVar4;
  if (*(char *)(lVar21 + lVar25) != '\x03') {
    if (*(char *)(lVar21 + lVar25) != '\0') goto LAB_0038ec1c;
    goto LAB_0038ef7f;
  }
  iVar15 = *(int *)(lVar11 + lVar25 * 4) + iVar4;
  iVar20 = iVar4 + 1;
  for (iVar13 = iVar20; iVar13 < iVar15; iVar13 = iVar13 + iVar18) {
    lVar22 = (long)iVar13;
    bVar1 = *(byte *)(lVar21 + lVar22);
    if (bVar1 == 6) {
      if ((iVar20 < iVar15) && (iVar13 = iVar20, *(int *)(lVar11 + lVar22 * 4) != 3))
      goto LAB_0038e994;
      break;
    }
    if (bVar1 == 0) goto LAB_0038ef7f;
    iVar18 = 1;
    if (bVar1 < 4) {
      iVar18 = *(int *)(lVar11 + lVar22 * 4);
    }
  }
  goto LAB_0038ec1c;
  while( true ) {
    if (bVar1 == 0) goto LAB_0038ef7f;
    iVar18 = 1;
    if (bVar1 < 4) {
      iVar18 = *(int *)(lVar11 + lVar22 * 4);
    }
    iVar15 = iVar15 + iVar18;
    if (iVar20 <= iVar15) break;
LAB_0038e760:
    lVar22 = (long)iVar15;
    bVar1 = *(byte *)(lVar21 + lVar22);
    if (bVar1 == 6) {
      if (*(int *)(lVar11 + lVar22 * 4) != 4) {
        uVar8 = 0xffffffff;
        iVar15 = iVar13;
        goto joined_r0x0038e7a6;
      }
      break;
    }
  }
  goto LAB_0038e8ce;
joined_r0x0038e7a6:
  if (iVar20 <= iVar15) goto LAB_0038e7de;
  lVar22 = (long)iVar15;
  bVar1 = *(byte *)(lVar21 + lVar22);
  if (bVar1 == 5) {
    uVar8 = *(uint *)(lVar11 + lVar22 * 4);
    goto LAB_0038e7de;
  }
  if (bVar1 == 0) goto LAB_0038ef7f;
  iVar18 = 1;
  if (bVar1 < 4) {
    iVar18 = *(int *)(lVar11 + lVar22 * 4);
  }
  iVar15 = iVar15 + iVar18;
  goto joined_r0x0038e7a6;
LAB_0038e7de:
  iVar15 = 0;
  if (iVar13 < iVar20) {
    lVar22 = 0;
    iVar15 = 0;
    iVar18 = iVar13;
    do {
      lVar23 = (long)iVar18;
      bVar1 = *(byte *)(lVar21 + lVar23);
      if (bVar1 == 4) {
        iVar15 = iVar15 + 1;
        if (lVar22 == 0) {
          lVar22 = lVar11 + lVar23 * 4;
        }
      }
      else {
        if (bVar1 == 0) goto LAB_0038ef7f;
        if (lVar22 != 0) break;
      }
      if (bVar1 == 0) goto LAB_0038ef7f;
      iVar19 = 1;
      if (bVar1 < 4) {
        iVar19 = *(int *)(lVar11 + lVar23 * 4);
      }
      iVar18 = iVar18 + iVar19;
    } while (iVar18 < iVar20);
  }
  Type = ~ABC_OPER_NONE;
  for (; iVar13 < iVar20; iVar13 = iVar13 + iVar18) {
    lVar22 = (long)iVar13;
    bVar1 = *(byte *)(lVar21 + lVar22);
    if (bVar1 == 6) {
      Type = *(Acb_ObjType_t *)(lVar11 + lVar22 * 4);
      break;
    }
    if (bVar1 == 0) goto LAB_0038ef7f;
    iVar18 = 1;
    if (bVar1 < 4) {
      iVar18 = *(int *)(lVar11 + lVar22 * 4);
    }
  }
  uVar6 = Acb_ObjAlloc(p_00,Type,iVar15,(int)lVar21);
  if (((int)uVar8 < 0) || (nNameIdMax <= (int)uVar8)) goto LAB_0038f004;
  *(uint *)((long)__s + (ulong)uVar8 * 4) = uVar6;
  if ((int)uVar6 < 1) goto LAB_0038f023;
  iVar13 = (p_00->vObjName).nSize;
  if (iVar13 < 1) goto LAB_0038effb;
  if (iVar13 <= (int)uVar6) goto LAB_0038ef9e;
  piVar10 = (p_00->vObjName).pArray;
  if (piVar10[uVar6] != 0) goto LAB_0038efdc;
  piVar10[uVar6] = uVar8;
LAB_0038e8ce:
  bVar1 = *(byte *)(*(long *)((long)pModule + 8) + lVar25);
  if (bVar1 == 0) goto LAB_0038ef7f;
  iVar13 = 1;
  if (bVar1 < 4) {
    iVar13 = *(int *)(*(long *)((long)pModule + 0x10) + lVar25 * 4);
  }
  iVar4 = iVar4 + iVar13;
  lVar11 = *(long *)((long)pModule + 0x10);
  if (*(int *)(lVar11 + 8) + 2 <= iVar4) goto LAB_0038e904;
  goto LAB_0038e6e4;
LAB_0038f023:
  pcVar12 = "i>0";
  goto LAB_0038f02a;
  while( true ) {
    if (bVar1 == 0) goto LAB_0038ef7f;
    iVar18 = 1;
    if (bVar1 < 4) {
      iVar18 = *(int *)(lVar11 + lVar22 * 4);
    }
    iVar13 = iVar13 + iVar18;
    if (iVar15 <= iVar13) break;
LAB_0038e994:
    lVar22 = (long)iVar13;
    bVar1 = *(byte *)(lVar21 + lVar22);
    if (bVar1 == 6) {
      if (*(int *)(lVar11 + lVar22 * 4) != 4) {
        uVar8 = 0xffffffff;
        iVar13 = iVar20;
        if (iVar15 <= iVar20) goto LAB_0038ea14;
        goto LAB_0038e9dc;
      }
      break;
    }
  }
  goto LAB_0038ec1c;
  while( true ) {
    if (bVar1 == 0) goto LAB_0038ef7f;
    iVar18 = 1;
    if (bVar1 < 4) {
      iVar18 = *(int *)(lVar11 + lVar22 * 4);
    }
    iVar13 = iVar13 + iVar18;
    if (iVar15 <= iVar13) break;
LAB_0038e9dc:
    lVar22 = (long)iVar13;
    bVar1 = *(byte *)(lVar21 + lVar22);
    if (bVar1 == 5) {
      uVar8 = *(uint *)(lVar11 + lVar22 * 4);
      goto LAB_0038ea14;
    }
  }
  uVar8 = 0xffffffff;
LAB_0038ea14:
  pcVar12 = Abc_NamStr(p->pStrs,uVar8);
  if (((int)uVar8 < 0) || (nNameIdMax <= (int)uVar8)) goto LAB_0038ef9e;
  uVar6 = *(uint *)((long)__s + (ulong)uVar8 * 4);
  lVar11 = *(long *)((long)pModule + 0x10);
  iVar13 = *(int *)(lVar11 + lVar25 * 4) + iVar4;
  if (iVar20 < iVar13) {
    lVar21 = 0;
    uVar7 = 0;
    do {
      lVar22 = (long)iVar20;
      bVar1 = *(byte *)(*(long *)((long)pModule + 8) + lVar22);
      if (bVar1 == 4) {
        uVar7 = uVar7 + 1;
        if (lVar21 == 0) {
          lVar21 = lVar11 + lVar22 * 4;
        }
      }
      else {
        if (bVar1 == 0) goto LAB_0038ef7f;
        if (lVar21 != 0) break;
      }
      if (bVar1 == 0) goto LAB_0038ef7f;
      iVar15 = 1;
      if (bVar1 < 4) {
        iVar15 = *(int *)(lVar11 + lVar22 * 4);
      }
      iVar20 = iVar20 + iVar15;
    } while (iVar20 < iVar13);
  }
  else {
    lVar21 = 0;
    uVar7 = 0;
  }
  if (0 < (int)uVar7) {
    uVar17 = 0;
    do {
      iVar13 = *(int *)(lVar21 + uVar17 * 4);
      if (((long)iVar13 < 0) || (nNameIdMax <= iVar13)) goto LAB_0038ef9e;
      if (*(int *)((long)__s + (long)iVar13 * 4) == 0) {
        printf("Cannot find fanin %d of node \"%s\".\n",uVar17 & 0xffffffff,pcVar12);
      }
      iVar13 = *(int *)(lVar21 + uVar17 * 4);
      if (((long)iVar13 < 0) || (nNameIdMax <= iVar13)) goto LAB_0038ef9e;
      if ((int)uVar6 < 1) goto LAB_0038f061;
      if ((p_00->vObjFans).nSize <= (int)uVar6) goto LAB_0038ef9e;
      iVar15 = (p_00->vObjFans).pArray[uVar6];
      if (((long)iVar15 < 0) || ((p_00->vFanSto).nSize <= iVar15)) goto LAB_0038efbd;
      iVar13 = *(int *)((long)__s + (long)iVar13 * 4);
      if (iVar13 < 1) goto LAB_0038f080;
      piVar10 = (p_00->vFanSto).pArray + iVar15;
      iVar15 = *piVar10;
      if (piVar10[(long)iVar15 + 1] != -1) goto LAB_0038f042;
      *piVar10 = iVar15 + 1;
      piVar10[(long)iVar15 + 1] = iVar13;
      uVar17 = uVar17 + 1;
    } while (uVar7 != uVar17);
  }
  if (vWeights == (Vec_Int_t *)0x0) {
    iVar13 = 1;
  }
  else {
    if (vWeights->nSize <= (int)uVar8) goto LAB_0038ef9e;
    iVar13 = vWeights->pArray[uVar8];
  }
  if ((int)uVar6 < 1) {
    pcVar12 = "i>0";
    goto LAB_0038f0c5;
  }
  iVar15 = (p_00->vObjWeight).nSize;
  if (iVar15 < 1) goto LAB_0038f0be;
  if (iVar15 <= (int)uVar6) goto LAB_0038ef9e;
  piVar10 = (p_00->vObjWeight).pArray;
  if (piVar10[uVar6] != 0) {
LAB_0038f09f:
    __assert_fail("Acb_ObjWeight(p, i)== 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acb.h"
                  ,0x11c,"void Acb_ObjSetWeight(Acb_Ntk_t *, int, int)");
  }
  piVar10[uVar6] = iVar13;
LAB_0038ec1c:
  bVar1 = *(byte *)(*(long *)((long)pModule + 8) + lVar25);
  if (bVar1 == 0) goto LAB_0038ef7f;
  iVar13 = 1;
  if (bVar1 < 4) {
    iVar13 = *(int *)(*(long *)((long)pModule + 0x10) + lVar25 * 4);
  }
  iVar4 = iVar4 + iVar13;
  lVar11 = *(long *)((long)pModule + 0x10);
  if (*(int *)(lVar11 + 8) + 2 <= iVar4) goto LAB_0038ec52;
  goto LAB_0038e91d;
LAB_0038f0be:
  pcVar12 = "Acb_NtkHasObjWeights(p)";
LAB_0038f0c5:
  __assert_fail(pcVar12,
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acb.h"
                ,0x10a,"int Acb_ObjWeight(Acb_Ntk_t *, int)");
LAB_0038effb:
  pcVar12 = "Acb_NtkHasObjNames(p)";
LAB_0038f02a:
  __assert_fail(pcVar12,
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acb.h"
                ,0x10d,"int Acb_ObjName(Acb_Ntk_t *, int)");
}

Assistant:

Acb_Ntk_t * Acb_NtkFromNdr( char * pFileName, void * pModule, Abc_Nam_t * pNames, Vec_Int_t * vWeights, int nNameIdMax )
{
    Ndr_Data_t * p   = (Ndr_Data_t *)pModule; 
    Acb_Man_t * pMan = Acb_ManAlloc( pFileName, 1, Abc_NamRef(pNames), NULL, NULL, NULL );
    int k, NameId = Abc_NamStrFindOrAdd( pMan->pStrs, pMan->pName, NULL );
    int Mod = 2, Obj, Type, nArray, * pArray, ObjId;
    int Token0 = Abc_NamStrFind( pMan->pStrs, "1\'b0" );
    Acb_Ntk_t * pNtk = Acb_NtkAlloc( pMan, NameId, Ndr_DataCiNum(p, Mod), Ndr_DataCoNum(p, Mod), Ndr_DataObjNum(p, Mod) );
    Vec_Int_t * vMap = Vec_IntStart( nNameIdMax );
    Acb_NtkCleanObjWeights( pNtk );
    Acb_NtkCleanObjNames( pNtk );
    Ndr_ModForEachPi( p, Mod, Obj )
    {
        NameId = Ndr_ObjReadBody( p, Obj, NDR_OUTPUT );
        ObjId  = Acb_ObjAlloc( pNtk, ABC_OPER_CI, 0, 0 );
        Vec_IntWriteEntry( vMap, NameId, ObjId );
        Acb_ObjSetName( pNtk, ObjId, NameId );
        Acb_ObjSetWeight( pNtk, ObjId, vWeights ? Vec_IntEntry(vWeights, NameId) : 1 );
    }
    Ndr_ModForEachTarget( p, Mod, Obj )
    {
        NameId = Ndr_DataEntry( p, Obj );
        ObjId  = Acb_ObjAlloc( pNtk, ABC_OPER_CONST_F, 0, 0 );
        Vec_IntWriteEntry( vMap, NameId, ObjId );
        Acb_ObjSetName( pNtk, ObjId, NameId );
        Vec_IntPush( &pNtk->vTargets, ObjId );
    }
    Ndr_ModForEachNode( p, Mod, Obj )
    {
        NameId = Ndr_ObjReadBody( p, Obj, NDR_OUTPUT );
        nArray = Ndr_ObjReadArray( p, Obj, NDR_INPUT, &pArray );
        Type   = Ndr_ObjReadBody( p, Obj, NDR_OPERTYPE );
        ObjId  = Acb_ObjAlloc( pNtk, (Acb_ObjType_t) Type, nArray, 0 );
        Vec_IntWriteEntry( vMap, NameId, ObjId );
        Acb_ObjSetName( pNtk, ObjId, NameId );
    }
    Ndr_ModForEachNode( p, Mod, Obj )
    {
        int NameId = Ndr_ObjReadBody( p, Obj, NDR_OUTPUT );
        char * pName = Abc_NamStr( pMan->pStrs, NameId );
        ObjId  = Vec_IntEntry( vMap, NameId );
        nArray = Ndr_ObjReadArray( p, Obj, NDR_INPUT, &pArray );
        for ( k = 0; k < nArray; k++ )
        {
            if ( Vec_IntEntry(vMap, pArray[k]) == 0 )
                printf( "Cannot find fanin %d of node \"%s\".\n", k, pName );
            Acb_ObjAddFanin( pNtk, ObjId, Vec_IntEntry(vMap, pArray[k]) );
        }
        Acb_ObjSetWeight( pNtk, ObjId, vWeights ? Vec_IntEntry(vWeights, NameId) : 1 );
    }
    Ndr_ModForEachPo( p, Mod, Obj )
    {
        int NameId = Ndr_ObjReadBody( p, Obj, NDR_OUTPUT );
        char * pName = Abc_NamStr( pMan->pStrs, NameId );
        nArray = Ndr_ObjReadArray( p, Obj, NDR_INPUT, &pArray );
        assert( nArray == 1 );
        ObjId  = Acb_ObjAlloc( pNtk, ABC_OPER_CO, 1, 0 );
        if ( Vec_IntEntry(vMap, pArray[0]) == 0 )
        {
            printf( "Adding constant 0 driver to non-driven PO \"%s\".\n", pName );
            Vec_IntWriteEntry( vMap, pArray[0], Token0 );
        }
        Acb_ObjAddFanin( pNtk, ObjId, Vec_IntEntry(vMap, pArray[0]) );
        Acb_ObjSetName( pNtk, ObjId, pArray[0] );
    }
    Vec_IntFree( vMap );
    Acb_NtkSetRegNum( pNtk, 0 );
    Acb_NtkAdd( pMan, pNtk );
    return pNtk;
}